

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

void __thiscall
capnp::InputStreamMessageReader::~InputStreamMessageReader(InputStreamMessageReader *this)

{
  bool bVar1;
  InputStreamMessageReader *in_RAX;
  anon_class_8_1_8991fb9c local_18;
  
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_002774b8;
  local_18.this = in_RAX;
  if (this->readPos != (byte *)0x0) {
    local_18.this = this;
    bVar1 = kj::UnwindDetector::isUnwinding(&this->unwindDetector);
    if (bVar1) {
      ~InputStreamMessageReader::anon_class_8_1_8991fb9c::operator()(&local_18);
    }
    else {
      ~InputStreamMessageReader::anon_class_8_1_8991fb9c::operator()(&local_18);
    }
  }
  kj::Array<capnp::word>::~Array(&this->ownedSpace);
  kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array(&this->moreSegments);
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)this);
  return;
}

Assistant:

InputStreamMessageReader::~InputStreamMessageReader() noexcept(false) {
  if (readPos != nullptr) {
    unwindDetector.catchExceptionsIfUnwinding([&]() {
      // Note that lazy reads only happen when we have multiple segments, so moreSegments.back() is
      // valid.
      const byte* allEnd = reinterpret_cast<const byte*>(moreSegments.back().end());
      inputStream.skip(allEnd - readPos);
    });
  }
}